

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O2

ssize_t __thiscall
YAML::ostream_wrapper::write(ostream_wrapper *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  ulong uVar2;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 in_register_00000034;
  void *__src;
  ulong __new_size;
  size_t i;
  void *pvVar3;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  if (this->m_pStream == (ostream *)0x0) {
    __new_size = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    uVar2 = (long)__buf + this->m_pos + 1;
    if (__new_size <= uVar2) {
      __new_size = uVar2;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,__new_size);
    pvVar1 = extraout_RAX;
    if (__buf != (void *)0x0) {
      pvVar1 = memmove((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + this->m_pos,__src,(size_t)__buf);
    }
  }
  else {
    pvVar1 = (void *)std::ostream::write((char *)this->m_pStream,(long)__src);
  }
  for (pvVar3 = (void *)0x0; __buf != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
    update_pos(this,*(char *)((long)__src + (long)pvVar3));
    pvVar1 = extraout_RAX_00;
  }
  return (ssize_t)pvVar1;
}

Assistant:

void ostream_wrapper::write(const char* str, std::size_t size) {
  if (m_pStream) {
    m_pStream->write(str, size);
  } else {
    m_buffer.resize(std::max(m_buffer.size(), m_pos + size + 1));
    std::copy(str, str + size, m_buffer.begin() + m_pos);
  }

  for (std::size_t i = 0; i < size; i++) {
    update_pos(str[i]);
  }
}